

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O2

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vExists;
  char *pcVar6;
  time_t tVar7;
  Abc_Ntk_t *pNtk_00;
  abctime aVar8;
  abctime aVar9;
  Abc_Ntk_t *pAVar10;
  Abc_Ntk_t *pNtk_01;
  ulong uVar11;
  ulong uVar12;
  Vec_Int_t *p_00;
  uint uVar13;
  int iVar14;
  int i;
  uint local_68;
  
  aVar3 = Abc_Clock();
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (pNtk->nObjCounts[8] == 0) {
      if (pNtk->vPos->nSize == 1) {
        if ((0 < nPars) && (iVar14 = pNtk->vPis->nSize, nPars < iVar14)) {
          if (fDumpCnf != 0) {
            pAig = Abc_NtkToDar(pNtk,0,0);
            p = Cnf_Derive(pAig,0);
            pVVar4 = Vec_IntStart(p->nVars);
            for (iVar14 = 0; iVar14 < pAig->vCis->nSize; iVar14 = iVar14 + 1) {
              pvVar5 = Vec_PtrEntry(pAig->vCis,iVar14);
              if (iVar14 < nPars) {
                Vec_IntWriteEntry(pVVar4,p->pVarNums[*(int *)((long)pvVar5 + 0x24)],1);
              }
            }
            vForAlls = Vec_IntAlloc(nPars);
            vExists = Vec_IntAlloc(pNtk->vPis->nSize - nPars);
            i = 0;
            iVar14 = pVVar4->nSize;
            if (pVVar4->nSize < 1) {
              iVar14 = i;
            }
            for (; iVar14 != i; i = i + 1) {
              iVar1 = Vec_IntEntry(pVVar4,i);
              p_00 = vForAlls;
              if (iVar1 == 0) {
                p_00 = vExists;
              }
              Vec_IntPush(p_00,i);
            }
            pcVar6 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
            Cnf_DataWriteIntoFile(p,pcVar6,0,vForAlls,vExists);
            Aig_ManStop(pAig);
            Cnf_DataFree(p);
            Vec_IntFree(vForAlls);
            Vec_IntFree(vExists);
            Vec_IntFree(pVVar4);
            printf("The 2QBF formula was written into file \"%s\".\n",pcVar6);
            return;
          }
          pVVar4 = Vec_IntStart(iVar14);
          tVar7 = time((time_t *)0x0);
          srand((uint)tVar7);
          for (iVar14 = nPars; iVar14 < pNtk->vPis->nSize; iVar14 = iVar14 + 1) {
            uVar2 = rand();
            Vec_IntWriteEntry(pVVar4,iVar14,uVar2 & 1);
          }
          Abc_NtkVectorClearPars(pVVar4,nPars);
          pNtk_00 = Abc_NtkMiterCofactor(pNtk,pVVar4);
          if (fVerbose != 0) {
            printf("Iter %2d : ",0);
            printf("AIG = %6d  ",(ulong)(uint)pNtk_00->nObjCounts[7]);
            Abc_NtkVectorPrintVars(pNtk,pVVar4,nPars);
            putchar(10);
          }
          uVar2 = 0;
          if (0 < nItersMax) {
            uVar2 = nItersMax;
          }
          uVar13 = 0;
          while (pNtk_01 = pNtk_00, local_68 = uVar2, uVar2 != uVar13) {
            aVar8 = Abc_Clock();
            iVar14 = Abc_NtkDSat(pNtk_00,0,0,0,0,0,1,0,0,0);
            aVar9 = Abc_Clock();
            local_68 = uVar13;
            if (iVar14 != 0) {
              if (iVar14 == -1) {
                pcVar6 = "Synthesis timed out.";
LAB_00269b50:
                puts(pcVar6);
              }
              else if (iVar14 != 1) goto LAB_0026995a;
              break;
            }
            Abc_NtkModelToVector(pNtk_00,pVVar4);
LAB_0026995a:
            Abc_NtkVectorClearVars(pNtk,pVVar4,nPars);
            pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar4);
            pvVar5 = Vec_PtrEntry(pAVar10->vPos,0);
            *(byte *)((long)pvVar5 + 0x15) = *(byte *)((long)pvVar5 + 0x15) ^ 4;
            Abc_Clock();
            iVar14 = Abc_NtkMiterSat(pAVar10,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
            Abc_Clock();
            if (iVar14 == 0) {
              Abc_NtkModelToVector(pAVar10,pVVar4);
              Abc_NtkDelete(pAVar10);
            }
            else {
              Abc_NtkDelete(pAVar10);
              if (iVar14 == -1) {
                pcVar6 = "Verification timed out.";
                goto LAB_00269b50;
              }
              if (iVar14 == 1) {
                Abc_NtkDelete(pNtk_00);
                uVar12 = 0;
                uVar11 = (ulong)(uint)pVVar4->nSize;
                if (pVVar4->nSize < 1) {
                  uVar11 = uVar12;
                }
                uVar2 = 0;
                for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
                  uVar2 = uVar2 + (pVVar4->pArray[uVar12] == 0);
                }
                printf("Parameters: ");
                Abc_NtkVectorPrintPars(pVVar4,nPars);
                printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar2,(ulong)(pVVar4->nSize - uVar2));
                iVar14 = 0x6f2464;
                printf("Solved after %d interations.  ",(ulong)uVar13);
                goto LAB_00269b89;
              }
            }
            Abc_NtkVectorClearPars(pVVar4,nPars);
            pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar4);
            pNtk_01 = Abc_NtkMiterAnd(pNtk_00,pAVar10,0,0);
            Abc_NtkDelete(pAVar10);
            Abc_NtkDelete(pNtk_00);
            uVar13 = uVar13 + 1;
            if (fVerbose != 0) {
              printf("Iter %2d : ",(ulong)uVar13);
              printf("AIG = %6d  ",(ulong)(uint)pNtk_01->nObjCounts[7]);
              Abc_NtkVectorPrintVars(pNtk,pVVar4,nPars);
              iVar14 = 0x7046aa;
              printf("  ");
              Abc_Print(iVar14,"%s =","Syn");
              Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar9 - aVar8) / 1000000.0);
            }
            pNtk_00 = pNtk_01;
            if (nItersMax == uVar13) break;
          }
          Abc_NtkDelete(pNtk_01);
          if (local_68 == nItersMax) {
            iVar14 = 0x6f2483;
            printf("Unsolved after %d interations.  ");
          }
          else {
            iVar14 = 0x6f24a4;
            printf("Implementation does not exist.  ");
          }
LAB_00269b89:
          Abc_Print(iVar14,"%s =","Total runtime");
          aVar8 = Abc_Clock();
          Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar8 - aVar3) / 1000000.0);
          Vec_IntFree(pVVar4);
          return;
        }
        pcVar6 = "nPars > 0 && nPars < Abc_NtkPiNum(pNtk)";
        uVar2 = 0x4d;
      }
      else {
        pcVar6 = "Abc_NtkPoNum(pNtk) == 1";
        uVar2 = 0x4c;
      }
    }
    else {
      pcVar6 = "Abc_NtkIsComb(pNtk)";
      uVar2 = 0x4b;
    }
  }
  else {
    pcVar6 = "Abc_NtkIsStrash(pNtk)";
    uVar2 = 0x4a;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                ,uVar2,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/*
   Implementation of a simple QBF solver along the lines of
   A. Solar-Lezama, L. Tancau, R. Bodik, V. Saraswat, and S. Seshia, 
   "Combinatorial sketching for finite programs", 12th International 
   Conference on Architectural Support for Programming Languages and 
   Operating Systems (ASPLOS 2006), San Jose, CA, October 2006.
*/

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// static void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues );
// static void Abc_NtkVectorClearPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorClearVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );

// extern int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose );

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Solve the QBF problem EpAx[M(p,x)].]

  Description [Variables p go first, followed by variable x.
  The number of parameters is nPars. The miter is in pNtk.
  The miter expresses EQUALITY of the implementation and spec.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
        if ( nIters+1 == nItersMax )
            break;
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d interations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Unsolved after %d interations.  ", nIters );
    else if ( nIters == nItersMax )
        printf( "Quit after %d interatios.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}